

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::rpc_session::stop(rpc_session *this)

{
  shared_ptr<nuraft::rpc_session> sStack_28;
  
  invoke_connection_callback(this,false);
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::rpc_session,void>
              ((__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,
               (__weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)>::operator()
              (&this->callback_,&sStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_28.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void stop() {
        invoke_connection_callback(false);
        close_socket();
        if (callback_) {
            callback_(this->shared_from_this());
        }
        handler_.reset();
    }